

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurrentThread.cc
# Opt level: O1

string * __thiscall
muduo::CurrentThread::stackTrace_abi_cxx11_
          (string *__return_storage_ptr__,CurrentThread *this,bool demangle)

{
  char cVar1;
  uint uVar2;
  void *__ptr;
  char *pcVar3;
  void *pvVar4;
  undefined7 in_register_00000011;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  bool bVar12;
  int status;
  size_t len;
  void *frame [200];
  int local_6a4;
  void *local_6a0;
  uint local_694;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_690;
  ulong local_688;
  undefined8 local_680;
  undefined1 local_678 [1608];
  
  uVar6 = (ulong)this & 0xffffffff;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar2 = backtrace(local_678,200,CONCAT71(in_register_00000011,demangle));
  __ptr = (void *)backtrace_symbols(local_678,uVar2);
  if (__ptr != (void *)0x0) {
    local_680 = 0x100;
    if ((char)uVar6 == '\0') {
      local_6a0 = (void *)0x0;
    }
    else {
      local_6a0 = malloc(0x100);
    }
    if (1 < (int)uVar2) {
      uVar9 = (ulong)uVar2;
      uVar5 = 1;
      local_694 = (uint)this;
      local_690 = &__return_storage_ptr__->field_2;
      local_688 = uVar9;
      do {
        if ((char)uVar6 == '\0') {
LAB_001184db:
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
        else {
          pcVar7 = (char *)0x0;
          pcVar10 = (char *)0x0;
          for (pcVar3 = *(char **)((long)__ptr + uVar5 * 8);
              ((cVar1 = *pcVar3, pcVar8 = pcVar3, pcVar11 = pcVar10, cVar1 == '(' ||
               (pcVar8 = pcVar7, pcVar11 = pcVar3, cVar1 == '+')) ||
              (pcVar11 = pcVar10, cVar1 != '\0')); pcVar3 = pcVar3 + 1) {
            pcVar7 = pcVar8;
            pcVar10 = pcVar11;
          }
          bVar12 = true;
          if (pcVar7 != (char *)0x0 && pcVar10 != (char *)0x0) {
            *pcVar10 = '\0';
            local_6a4 = 0;
            pvVar4 = (void *)__cxa_demangle(pcVar7 + 1,local_6a0,&local_680,&local_6a4);
            *pcVar10 = '+';
            bVar12 = local_6a4 != 0;
            if (!bVar12) {
              std::__cxx11::string::replace
                        ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,
                         (char *)0x0,*(ulong *)((long)__ptr + uVar5 * 8));
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              std::__cxx11::string::push_back((char)__return_storage_ptr__);
              local_6a0 = pvVar4;
            }
          }
          uVar6 = (ulong)local_694;
          uVar9 = local_688;
          if (bVar12) goto LAB_001184db;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar9);
    }
    free(local_6a0);
    free(__ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

string stackTrace(bool demangle)
{
  string stack;
  const int max_frames = 200;
  void* frame[max_frames];
  int nptrs = ::backtrace(frame, max_frames);
  char** strings = ::backtrace_symbols(frame, nptrs);
  if (strings)
  {
    size_t len = 256;
    char* demangled = demangle ? static_cast<char*>(::malloc(len)) : nullptr;
    for (int i = 1; i < nptrs; ++i)  // skipping the 0-th, which is this function
    {
      if (demangle)
      {
        // https://panthema.net/2008/0901-stacktrace-demangled/
        // bin/exception_test(_ZN3Bar4testEv+0x79) [0x401909]
        char* left_par = nullptr;
        char* plus = nullptr;
        for (char* p = strings[i]; *p; ++p)
        {
          if (*p == '(')
            left_par = p;
          else if (*p == '+')
            plus = p;
        }

        if (left_par && plus)
        {
          *plus = '\0';
          int status = 0;
          char* ret = abi::__cxa_demangle(left_par+1, demangled, &len, &status);
          *plus = '+';
          if (status == 0)
          {
            demangled = ret;  // ret could be realloc()
            stack.append(strings[i], left_par+1);
            stack.append(demangled);
            stack.append(plus);
            stack.push_back('\n');
            continue;
          }
        }
      }
      // Fallback to mangled names
      stack.append(strings[i]);
      stack.push_back('\n');
    }
    free(demangled);
    free(strings);
  }
  return stack;
}